

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_test.cpp
# Opt level: O0

void system_test::setValueTest(void)

{
  SystemImpl *this;
  double dVar1;
  SystemImpl *sys;
  double v;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  (*(code *)**(undefined8 **)this)(0x4014000000000000);
  dVar1 = (double)(**(code **)(*(long *)this + 8))();
  if ((dVar1 == 5.0) && (!NAN(dVar1))) {
    return;
  }
  __assert_fail("sys->getValue() == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/unit_tests/system_test.cpp"
                ,0x18,"static void system_test::setValueTest()");
}

Assistant:

void system_test::setValueTest() {
    double v = 5;
    auto *sys = new SystemImpl();
    sys->setValue(v);
    assert(sys->getValue() == v);
}